

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_mvclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint32_t uVar1;
  uint64_t unaff_retaddr;
  uint32_t cc;
  uint16_t pad;
  uint64_t src;
  uint64_t srclen;
  uint64_t dest;
  uint64_t destlen;
  uintptr_t ra;
  uint64_t uStack_20;
  uint32_t r3_local;
  uint64_t a2_local;
  CPUS390XState_conflict *pCStack_10;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  destlen = unaff_retaddr;
  ra._4_4_ = r3;
  uStack_20 = a2;
  a2_local._4_4_ = r1;
  pCStack_10 = env;
  dest = get_length(env,r1 + 1);
  srclen = get_address(pCStack_10,a2_local._4_4_);
  src = get_length(pCStack_10,ra._4_4_ + 1);
  _cc = get_address(pCStack_10,ra._4_4_);
  uVar1 = do_mvcl(pCStack_10,&srclen,&dest,(uint64_t *)&cc,&src,(uint16_t)uStack_20,2,destlen);
  set_length(pCStack_10,a2_local._4_4_ + 1,dest);
  set_length(pCStack_10,ra._4_4_ + 1,src);
  set_address(pCStack_10,a2_local._4_4_,srclen);
  set_address(pCStack_10,ra._4_4_,_cc);
  return uVar1;
}

Assistant:

uint32_t HELPER(mvclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t destlen = get_length(env, r1 + 1);
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = get_length(env, r3 + 1);
    uint64_t src = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc;

    cc = do_mvcl(env, &dest, &destlen, &src, &srclen, pad, 2, ra);

    set_length(env, r1 + 1, destlen);
    set_length(env, r3 + 1, srclen);
    set_address(env, r1, dest);
    set_address(env, r3, src);

    return cc;
}